

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O2

sljit_s32 sljit_emit_icall(sljit_compiler *compiler,sljit_s32 type,sljit_s32 arg_types,sljit_s32 src
                          ,sljit_sw srcw)

{
  sljit_s32 in_EAX;
  uint uVar1;
  sljit_s32 sVar2;
  int iVar3;
  undefined4 in_register_00000014;
  
  if (compiler->error != 0) {
    return in_EAX;
  }
  compiler->mode32 = 0;
  uVar1 = 0;
  for (; 0xf < (uint)type; type = (uint)type >> 4) {
    uVar1 = uVar1 + ((type & 0xf0U) < 0x50);
  }
  if (uVar1 != 0) {
    if ((uVar1 < 3) || (sVar2 = emit_mov(compiler,0xf,0,3,0), sVar2 == 0)) {
      iVar3 = emit_mov(compiler,3,0,1,0);
    }
    else {
      iVar3 = compiler->error;
    }
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  sVar2 = sljit_emit_ijump(compiler,0x1a,0x40,CONCAT44(in_register_00000014,arg_types));
  return sVar2;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_icall(struct sljit_compiler *compiler, sljit_s32 type,
	sljit_s32 arg_types,
	sljit_s32 src, sljit_sw srcw)
{
	CHECK_ERROR();
	CHECK(check_sljit_emit_icall(compiler, type, arg_types, src, srcw));

	FAIL_IF(call_with_args(compiler, arg_types, &src, srcw));

#if (defined SLJIT_VERBOSE && SLJIT_VERBOSE) \
		|| (defined SLJIT_ARGUMENT_CHECKS && SLJIT_ARGUMENT_CHECKS)
	compiler->skip_checks = 1;
#endif

	return sljit_emit_ijump(compiler, type, src, srcw);
}